

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint64_t cpu_ldq_data_ra_mipsel
                   (CPUArchState_conflict8 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  uint mmu_idx;
  
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  uVar1 = cpu_ldq_mmuidx_ra_mipsel(env,ptr,mmu_idx,retaddr);
  return uVar1;
}

Assistant:

uint64_t cpu_ldq_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldq_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}